

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void finish_productions(Grammar *g)

{
  Rule **ppRVar1;
  uint uVar2;
  Production *pPVar3;
  Elem **ppEVar4;
  Rule **ppRVar5;
  Rule *__s;
  Elem *pEVar6;
  undefined8 *elem;
  anon_struct_40_4_d8687ec6_for_rules *v;
  
  pPVar3 = *(g->productions).v;
  __s = (Rule *)malloc(0xa8);
  memset(__s,0,0xa8);
  __s->prod = pPVar3;
  pEVar6 = (Elem *)malloc(0x20);
  pEVar6->kind = ELEM_NTERM;
  pEVar6->index = 0;
  pEVar6->rule = (Rule *)0x0;
  (pEVar6->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar6->e + 8) = 0;
  __s->end = pEVar6;
  pEVar6->kind = ELEM_END;
  pEVar6->rule = __s;
  __s->action_index = g->action_index;
  ppEVar4 = (__s->elems).v;
  if (ppEVar4 == (Elem **)0x0) {
    pEVar6 = (Elem *)malloc(0x20);
    pEVar6->kind = ELEM_NTERM;
    pEVar6->index = 0;
    pEVar6->rule = (Rule *)0x0;
    (pEVar6->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar6->e + 8) = 0;
    pEVar6->rule = __s;
    (__s->elems).v = (__s->elems).e;
    uVar2 = (__s->elems).n;
    (__s->elems).n = uVar2 + 1;
    (__s->elems).e[uVar2] = pEVar6;
  }
  else {
    uVar2 = (__s->elems).n;
    if (ppEVar4 == (__s->elems).e) {
      if (2 < uVar2) goto LAB_0013a6e0;
      pEVar6 = (Elem *)malloc(0x20);
      pEVar6->kind = ELEM_NTERM;
      pEVar6->index = 0;
      pEVar6->rule = (Rule *)0x0;
      (pEVar6->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar6->e + 8) = 0;
      pEVar6->rule = __s;
    }
    else {
      if ((uVar2 & 7) == 0) {
LAB_0013a6e0:
        elem = (undefined8 *)malloc(0x20);
        *elem = 0;
        elem[1] = 0;
        elem[2] = 0;
        elem[3] = 0;
        elem[1] = __s;
        vec_add_internal(&__s->elems,elem);
        goto LAB_0013a70a;
      }
      pEVar6 = (Elem *)malloc(0x20);
      pEVar6->kind = ELEM_NTERM;
      pEVar6->index = 0;
      pEVar6->rule = (Rule *)0x0;
      (pEVar6->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar6->e + 8) = 0;
      pEVar6->rule = __s;
    }
    (__s->elems).n = uVar2 + 1;
    ppEVar4[uVar2] = pEVar6;
  }
LAB_0013a70a:
  ppRVar5 = (pPVar3->rules).v;
  ppRVar1 = (pPVar3->rules).e;
  if (ppRVar5 == (Rule **)0x0) {
    (pPVar3->rules).v = ppRVar1;
    uVar2 = (pPVar3->rules).n;
    (pPVar3->rules).n = uVar2 + 1;
    (pPVar3->rules).e[uVar2] = __s;
    goto LAB_0013a760;
  }
  v = &pPVar3->rules;
  uVar2 = v->n;
  if (ppRVar5 == ppRVar1) {
    if (2 < uVar2) goto LAB_0013a755;
  }
  else if ((uVar2 & 7) == 0) {
LAB_0013a755:
    vec_add_internal(v,__s);
    goto LAB_0013a760;
  }
  v->n = uVar2 + 1;
  ppRVar5[uVar2] = __s;
LAB_0013a760:
  ((*(__s->elems).v)->e).nterm = (g->productions).v[1];
  return;
}

Assistant:

void finish_productions(Grammar *g) {
  Production *pp = g->productions.v[0];
  Rule *rr = new_rule(g, pp);
  vec_add(&rr->elems, new_elem_nterm(NULL, rr));
  vec_add(&pp->rules, rr);
  rr->elems.v[0]->e.nterm = g->productions.v[1];
}